

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int mg_rpc_create_request(char *buf,int len,char *method,char *id,char *params_fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [40];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  int local_4c;
  undefined1 local_48 [4];
  int n;
  va_list ap;
  char *params_fmt_local;
  char *id_local;
  char *method_local;
  int len_local;
  char *buf_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_4c = 0;
  local_e0 = in_R9;
  ap[0].reg_save_area = params_fmt;
  iVar1 = json_emit(buf,len,"{s:s,s:s,s:s,s:","jsonrpc","2.0","id",id,"method",method,"params");
  local_4c = local_4c + iVar1;
  ap[0].overflow_arg_area = local_108;
  ap[0]._0_8_ = &stack0x00000008;
  n = 0x30;
  local_48 = (undefined1  [4])0x28;
  iVar1 = json_emit_va(buf + local_4c,len - local_4c,(char *)ap[0].reg_save_area,
                       (__va_list_tag *)local_48);
  local_4c = local_4c + iVar1;
  iVar1 = json_emit(buf + local_4c,len - local_4c,"}");
  return local_4c + iVar1;
}

Assistant:

int mg_rpc_create_request(char *buf, int len, const char *method,
                          const char *id, const char *params_fmt, ...) {
    va_list ap;
    int n = 0;

    n += json_emit(buf + n, len - n, "{s:s,s:s,s:s,s:", "jsonrpc", "2.0", "id",
                   id, "method", method, "params");
    va_start(ap, params_fmt);
    n += json_emit_va(buf + n, len - n, params_fmt, ap);
    va_end(ap);

    n += json_emit(buf + n, len - n, "}");

    return n;
}